

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CMU462::Collada::ColladaParser::parse_material(XMLElement *xml,MaterialInfo *material)

{
  bool bVar1;
  XMLElement *pXVar2;
  XMLElement *pXVar3;
  char *pcVar4;
  BSDF *pBVar5;
  XMLElement *pXVar6;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar9;
  Spectrum SVar10;
  allocator local_2f1;
  XMLElement *local_2f0;
  undefined1 local_2e8 [24];
  float local_2d0;
  float local_2cc;
  undefined1 local_2c8 [24];
  MaterialInfo *local_2b0;
  undefined1 local_2a8 [16];
  _func_int **local_298;
  _func_int **local_290;
  _func_int **local_288;
  undefined **local_280;
  _func_int **local_278;
  string type;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::assign((char *)&(material->super_Instance).id);
  tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  std::__cxx11::string::assign((char *)&(material->super_Instance).name);
  (material->super_Instance).type = MATERIAL;
  local_2b0 = material;
  std::__cxx11::string::string((string *)&local_210,"instance_effect",(allocator *)&type);
  pXVar2 = get_element(xml,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  if (pXVar2 == (XMLElement *)0x0) {
    exit(1);
  }
  pXVar3 = get_technique_common(pXVar2);
  pXVar2 = get_technique_cmu462(pXVar2);
  if (pXVar2 != (XMLElement *)0x0) {
    pXVar2 = tinyxml2::XMLNode::FirstChildElement(&pXVar2->super_XMLNode,(char *)0x0);
    local_278 = (_func_int **)&PTR_f_002810b8;
    local_280 = &PTR__Sampler3D_00281190;
    local_288 = (_func_int **)&PTR_f_00280fb0;
    local_290 = (_func_int **)&PTR_f_00281008;
    local_298 = (_func_int **)&PTR_f_00281060;
    do {
      if (pXVar2 == (XMLElement *)0x0) {
        return;
      }
      pcVar4 = tinyxml2::XMLNode::Value(&pXVar2->super_XMLNode);
      std::__cxx11::string::string((string *)&type,pcVar4,&local_2f1);
      bVar1 = std::operator==(&type,"emission");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_50,"radiance",&local_2f1);
        pXVar3 = get_element(pXVar2,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
        std::__cxx11::string::string((string *)&local_70,pcVar4,&local_2f1);
        SVar10 = spectrum_from_string(&local_70);
        local_2e8._8_4_ = extraout_XMM0_Dc;
        local_2e8._0_8_ = SVar10._0_8_;
        local_2e8._12_4_ = extraout_XMM0_Dd;
        local_2f0 = (XMLElement *)CONCAT44(local_2f0._4_4_,SVar10.b);
        std::__cxx11::string::~string((string *)&local_70);
        pBVar5 = (BSDF *)operator_new(0x28);
        (pBVar5->rasterize_color).r = 0.0;
        (pBVar5->rasterize_color).g = 0.0;
        (pBVar5->rasterize_color).b = 0.0;
        pBVar5->_vptr_BSDF = local_278;
        *(undefined8 *)&pBVar5->field_0x14 = local_2e8._0_8_;
        *(float *)((long)&pBVar5[1]._vptr_BSDF + 4) = local_2f0._0_4_;
        *(undefined ***)&pBVar5[1].rasterize_color = local_280;
LAB_001781e5:
        local_2b0->bsdf = pBVar5;
      }
      else {
        bVar1 = std::operator==(&type,"mirror");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_90,"reflectance",&local_2f1);
          pXVar3 = get_element(pXVar2,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
          std::__cxx11::string::string((string *)&local_b0,pcVar4,&local_2f1);
          SVar10 = spectrum_from_string(&local_b0);
          local_2e8._8_4_ = extraout_XMM0_Dc_00;
          local_2e8._0_8_ = SVar10._0_8_;
          local_2e8._12_4_ = extraout_XMM0_Dd_00;
          local_2f0 = (XMLElement *)CONCAT44(local_2f0._4_4_,SVar10.b);
          std::__cxx11::string::~string((string *)&local_b0);
          pBVar5 = (BSDF *)operator_new(0x28);
          pBVar5->_vptr_BSDF = local_288;
          *(undefined4 *)&pBVar5[1]._vptr_BSDF = local_2e8._0_4_;
          *(undefined4 *)((long)&pBVar5[1]._vptr_BSDF + 4) = local_2e8._4_4_;
          pBVar5[1].rasterize_color.r = local_2f0._0_4_;
          fVar7 = (float)local_2e8._0_4_;
          fVar8 = (float)local_2e8._4_4_;
          fVar9 = local_2f0._0_4_;
LAB_001781dc:
          (pBVar5->rasterize_color).r = fVar7;
          (pBVar5->rasterize_color).g = fVar8;
          (pBVar5->rasterize_color).b = fVar9;
          goto LAB_001781e5;
        }
        bVar1 = std::operator==(&type,"refraction");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_d0,"transmittance",&local_2f1);
          pXVar3 = get_element(pXVar2,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::string((string *)&local_f0,"roughness",&local_2f1);
          pXVar6 = get_element(pXVar2,&local_f0);
          local_2e8._0_8_ = pXVar6;
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::string((string *)&local_110,"ior",&local_2f1);
          local_2f0 = get_element(pXVar2,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
          std::__cxx11::string::string((string *)&local_130,pcVar4,&local_2f1);
          SVar10 = spectrum_from_string(&local_130);
          local_2c8._8_4_ = extraout_XMM0_Dc_01;
          local_2c8._0_8_ = SVar10._0_8_;
          local_2c8._12_4_ = extraout_XMM0_Dd_01;
          local_2a8._0_4_ = SVar10.b;
          std::__cxx11::string::~string((string *)&local_130);
          pcVar4 = tinyxml2::XMLElement::GetText((XMLElement *)local_2e8._0_8_);
          local_2e8._0_8_ = atof(pcVar4);
          pcVar4 = tinyxml2::XMLElement::GetText(local_2f0);
          local_2f0 = (XMLElement *)atof(pcVar4);
          pBVar5 = (BSDF *)operator_new(0x28);
          pBVar5->_vptr_BSDF = local_290;
          *(float *)&pBVar5->field_0x14 = (float)(double)local_2f0;
          *(float *)&pBVar5[1]._vptr_BSDF = (float)(double)local_2e8._0_8_;
          *(undefined4 *)((long)&pBVar5[1]._vptr_BSDF + 4) = local_2c8._0_4_;
          pBVar5[1].rasterize_color.r = (float)local_2c8._4_4_;
          pBVar5[1].rasterize_color.g = (float)local_2a8._0_4_;
          fVar7 = (float)local_2c8._0_4_;
          fVar8 = (float)local_2c8._4_4_;
          fVar9 = (float)local_2a8._0_4_;
          goto LAB_001781dc;
        }
        bVar1 = std::operator==(&type,"glass");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_150,"transmittance",&local_2f1);
          pXVar3 = get_element(pXVar2,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::string((string *)&local_170,"reflectance",&local_2f1);
          pXVar6 = get_element(pXVar2,&local_170);
          local_2e8._0_8_ = pXVar6;
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::string((string *)&local_190,"roughness",&local_2f1);
          local_2f0 = get_element(pXVar2,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::string((string *)&local_1b0,"ior",&local_2f1);
          pXVar6 = get_element(pXVar2,&local_1b0);
          local_2c8._0_8_ = pXVar6;
          std::__cxx11::string::~string((string *)&local_1b0);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
          std::__cxx11::string::string((string *)&local_1d0,pcVar4,&local_2f1);
          SVar10 = spectrum_from_string(&local_1d0);
          local_2cc = SVar10.b;
          local_2a8._8_4_ = extraout_XMM0_Dc_02;
          local_2a8._0_8_ = SVar10._0_8_;
          local_2a8._12_4_ = extraout_XMM0_Dd_02;
          std::__cxx11::string::~string((string *)&local_1d0);
          pcVar4 = tinyxml2::XMLElement::GetText((XMLElement *)local_2e8._0_8_);
          std::__cxx11::string::string((string *)&local_1f0,pcVar4,&local_2f1);
          SVar10 = spectrum_from_string(&local_1f0);
          local_2d0 = SVar10.b;
          local_2e8._8_4_ = extraout_XMM0_Dc_03;
          local_2e8._0_8_ = SVar10._0_8_;
          local_2e8._12_4_ = extraout_XMM0_Dd_03;
          std::__cxx11::string::~string((string *)&local_1f0);
          pcVar4 = tinyxml2::XMLElement::GetText(local_2f0);
          local_2f0 = (XMLElement *)atof(pcVar4);
          pcVar4 = tinyxml2::XMLElement::GetText((XMLElement *)local_2c8._0_8_);
          local_2c8._0_8_ = atof(pcVar4);
          pBVar5 = (BSDF *)operator_new(0x38);
          pBVar5->_vptr_BSDF = local_298;
          *(float *)&pBVar5->field_0x14 = (float)(double)local_2c8._0_8_;
          *(float *)&pBVar5[1]._vptr_BSDF = (float)(double)local_2f0;
          *(undefined8 *)((long)&pBVar5[1]._vptr_BSDF + 4) = local_2e8._0_8_;
          pBVar5[1].rasterize_color.g = local_2d0;
          pBVar5[1].rasterize_color.b = (float)local_2a8._0_4_;
          *(undefined4 *)&pBVar5[1].field_0x14 = local_2a8._4_4_;
          *(float *)&pBVar5[2]._vptr_BSDF = local_2cc;
          fVar7 = (float)local_2a8._0_4_;
          fVar8 = (float)local_2a8._4_4_;
          fVar9 = local_2cc;
          goto LAB_001781dc;
        }
      }
      pXVar2 = tinyxml2::XMLNode::NextSiblingElement(&pXVar2->super_XMLNode,(char *)0x0);
      std::__cxx11::string::~string((string *)&type);
    } while( true );
  }
  if (pXVar3 != (XMLElement *)0x0) {
    std::__cxx11::string::string((string *)&local_230,"phong/diffuse/color",(allocator *)&type);
    pXVar2 = get_element(pXVar3,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    if (pXVar2 != (XMLElement *)0x0) {
      pcVar4 = tinyxml2::XMLElement::GetText(pXVar2);
      std::__cxx11::string::string((string *)&local_250,pcVar4,(allocator *)&type);
      SVar10 = spectrum_from_string(&local_250);
      local_2e8._8_4_ = extraout_XMM0_Dc_04;
      local_2e8._0_8_ = SVar10._0_8_;
      local_2e8._12_4_ = extraout_XMM0_Dd_04;
      local_2f0 = (XMLElement *)CONCAT44(local_2f0._4_4_,SVar10.b);
      std::__cxx11::string::~string((string *)&local_250);
      pBVar5 = (BSDF *)operator_new(0x28);
      pBVar5->_vptr_BSDF = (_func_int **)&PTR_f_00280f58;
      *(undefined8 *)&pBVar5->field_0x14 = local_2e8._0_8_;
      *(float *)((long)&pBVar5[1]._vptr_BSDF + 4) = local_2f0._0_4_;
      *(undefined ***)&pBVar5[1].rasterize_color = &PTR__Sampler3D_00281190;
      (pBVar5->rasterize_color).r = (float)local_2e8._0_4_;
      (pBVar5->rasterize_color).g = (float)local_2e8._4_4_;
      (pBVar5->rasterize_color).b = local_2f0._0_4_;
      goto LAB_00178321;
    }
  }
  pBVar5 = (BSDF *)operator_new(0x28);
  pBVar5->_vptr_BSDF = (_func_int **)&PTR_f_00280f58;
  pBVar5[1]._vptr_BSDF = (_func_int **)0x3f0000003f000000;
  *(undefined ***)&pBVar5[1].rasterize_color = &PTR__Sampler3D_00281190;
  (pBVar5->rasterize_color).r = 0.5;
  (pBVar5->rasterize_color).g = 0.5;
  *(undefined8 *)&(pBVar5->rasterize_color).b = 0x3f0000003f000000;
LAB_00178321:
  local_2b0->bsdf = pBVar5;
  return;
}

Assistant:

void ColladaParser::parse_material(XMLElement* xml, MaterialInfo& material) {
  // name & id
  material.id = xml->Attribute("id");
  material.name = xml->Attribute("name");
  material.type = Instance::MATERIAL;

  // parse effect
  XMLElement* e_effect = get_element(xml, "instance_effect");
  if (e_effect) {
    // if the material does not have additional specification in the 462
    // profile. The diffuse color will be used to create a diffuse BSDF,
    // Other information from the common profile are ignored

    XMLElement* tech_common = get_technique_common(e_effect);  // common profile
    XMLElement* tech_cmu462 = get_technique_cmu462(e_effect);  // cmu462 profile

    if (tech_cmu462) {
      XMLElement* e_bsdf = tech_cmu462->FirstChildElement();
      while (e_bsdf) {
        string type = e_bsdf->Name();
        if (type == "emission") {
          XMLElement* e_radiance = get_element(e_bsdf, "radiance");
          Spectrum radiance =
              spectrum_from_string(string(e_radiance->GetText()));
          BSDF* bsdf = new EmissionBSDF(radiance);
          material.bsdf = bsdf;
        } else if (type == "mirror") {
          XMLElement* e_reflectance = get_element(e_bsdf, "reflectance");
          Spectrum reflectance =
              spectrum_from_string(string(e_reflectance->GetText()));
          BSDF* bsdf = new MirrorBSDF(reflectance);
          material.bsdf = bsdf;
          /*
          if (type == "glossy") {
            XMLElement *e_reflectance  = get_element(e_bsdf, "reflectance");
            XMLElement *e_roughness = get_element(e_bsdf, "roughness");
            Spectrum reflectance =
          spectrum_from_string(string(e_reflectance->GetText()));
            float roughness = atof(e_roughness->GetText());
            BSDF* bsdf = new GlossyBSDF(reflectance, roughness);
            material.bsdf = bsdf;
          */
        } else if (type == "refraction") {
          XMLElement* e_transmittance = get_element(e_bsdf, "transmittance");
          XMLElement* e_roughness = get_element(e_bsdf, "roughness");
          XMLElement* e_ior = get_element(e_bsdf, "ior");
          Spectrum transmittance =
              spectrum_from_string(string(e_transmittance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf = new RefractionBSDF(transmittance, roughness, ior);
          material.bsdf = bsdf;
        } else if (type == "glass") {
          XMLElement* e_transmittance = get_element(e_bsdf, "transmittance");
          XMLElement* e_reflectance = get_element(e_bsdf, "reflectance");
          XMLElement* e_roughness = get_element(e_bsdf, "roughness");
          XMLElement* e_ior = get_element(e_bsdf, "ior");
          Spectrum transmittance =
              spectrum_from_string(string(e_transmittance->GetText()));
          Spectrum reflectance =
              spectrum_from_string(string(e_reflectance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf =
              new GlassBSDF(transmittance, reflectance, roughness, ior);
          material.bsdf = bsdf;
        }

        e_bsdf = e_bsdf->NextSiblingElement();
      }
    } else if (tech_common) {
      XMLElement* e_diffuse = get_element(tech_common, "phong/diffuse/color");
      if (e_diffuse) {
        Spectrum albedo = spectrum_from_string(string(e_diffuse->GetText()));
        material.bsdf = new DiffuseBSDF(albedo);
      } else {
        material.bsdf = new DiffuseBSDF(Spectrum(.5f, .5f, .5f));
      }
    } else {
      BSDF* bsdf = new DiffuseBSDF(Spectrum(.5f, .5f, .5f));
      material.bsdf = bsdf;
    }
  } else {
    stat("Error: no target effects found for material: " << material.id);
    exit(EXIT_FAILURE);
  }

  // print summary
  stat("  |- " << material);
}